

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  Headers *pHVar1;
  _Rb_tree_header *p_Var2;
  string *this_00;
  Response *pRVar3;
  size_t length_00;
  pointer ppVar4;
  pointer ppVar5;
  detail *pdVar6;
  anon_class_16_2_62572841 content;
  char cVar7;
  int iVar8;
  const_iterator cVar9;
  iterator __position;
  ulong uVar10;
  ulong uVar11;
  size_t offset;
  char *pcVar12;
  char cVar13;
  detail *pdVar14;
  Response *content_length;
  bool bVar15;
  string length;
  string content_type;
  string boundary;
  undefined8 uVar16;
  char *pcVar17;
  undefined8 length_01;
  undefined1 auStack_110 [8];
  undefined1 local_108 [24];
  size_t sStack_f0;
  Request *local_e8;
  Server *local_e0;
  Stream *local_d8;
  string local_d0;
  _Alloc_hider local_b0;
  Response *pRStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [32];
  _Invoker_type local_70 [2];
  long local_60 [2];
  _Base_ptr local_50 [2];
  size_t local_40;
  
  local_e8 = req;
  local_d8 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h"
                  ,0xb79,
                  "bool httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  content_length = res;
  local_e0 = this;
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
  }
  iVar8 = res->status;
  switch(iVar8) {
  case 400:
    break;
  case 0x191:
    break;
  case 0x192:
  case 0x195:
  case 0x196:
  case 0x197:
  case 0x198:
  case 0x199:
  case 0x19a:
  case 0x19b:
  case 0x19c:
switchD_00121aac_caseD_192:
    break;
  case 0x193:
    break;
  case 0x194:
    break;
  case 0x19d:
    break;
  case 0x19e:
    break;
  case 0x19f:
    break;
  case 0x1a0:
    break;
  default:
    switch(iVar8) {
    case 200:
      break;
    case 0xc9:
    case 0xcb:
    case 0xcd:
      goto switchD_00121aac_caseD_192;
    case 0xca:
      break;
    case 0xcc:
      break;
    case 0xce:
      break;
    default:
      switch(iVar8) {
      case 0x12d:
        break;
      case 0x12e:
        break;
      case 0x12f:
        break;
      case 0x130:
        break;
      default:
        goto switchD_00121aac_caseD_192;
      }
    }
  }
  iVar8 = Stream::write_format<int,char_const*>
                    (local_d8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&stack0xfffffffffffffee8);
  if (iVar8 == 0) {
    return false;
  }
  bVar15 = true;
  if (!last_connection) {
    pHVar1 = &local_e8->headers;
    uVar16 = auStack_110 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffee8,"Connection","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar1->_M_t,(key_type *)&stack0xfffffffffffffee8);
    if ((undefined1 *)uVar16 != auStack_110 + 8) {
      operator_delete((void *)uVar16,local_108._0_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar9._M_node == &(local_e8->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)(cVar9._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_50,pcVar17,(allocator *)&stack0xfffffffffffffee8);
    iVar8 = std::__cxx11::string::compare((char *)local_50);
    bVar15 = iVar8 == 0;
  }
  if ((!last_connection) && (local_50[0] != (_Base_ptr)&local_40)) {
    operator_delete(local_50[0],local_40 + 1);
  }
  if (bVar15) {
    local_70[0] = (_Invoker_type)0x13799c;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)&stack0xfffffffffffffee8,(char **)local_70);
  }
  if (last_connection) {
    bVar15 = false;
  }
  else {
    pHVar1 = &local_e8->headers;
    uVar16 = auStack_110 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffee8,"Connection","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar1->_M_t,(key_type *)&stack0xfffffffffffffee8);
    if ((undefined1 *)uVar16 != auStack_110 + 8) {
      operator_delete((void *)uVar16,local_108._0_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar9._M_node == &(local_e8->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)(cVar9._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_70,pcVar17,(allocator *)&stack0xfffffffffffffee8);
    iVar8 = std::__cxx11::string::compare((char *)local_70);
    bVar15 = iVar8 == 0;
  }
  if ((!last_connection) && (local_70[0] != (_Invoker_type)local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (bVar15) {
    local_d0._M_dataplus._M_p = "Keep-Alive";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)&stack0xfffffffffffffee8,(char **)&local_d0);
  }
  pHVar1 = &res->headers;
  pRVar3 = (Response *)(auStack_110 + 8);
  uVar16 = pRVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffee8,"Content-Type","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&pHVar1->_M_t,(key_type *)&stack0xfffffffffffffee8);
  if ((Response *)uVar16 != pRVar3) {
    operator_delete((void *)uVar16,local_108._0_8_ + 1);
  }
  p_Var2 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
    local_d0._M_dataplus._M_p = "text/plain";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar1,(char **)&stack0xfffffffffffffee8,(char **)&local_d0);
  }
  pcVar17 = (char *)pRVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffee8,"Accept-Ranges","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&pHVar1->_M_t,(key_type *)&stack0xfffffffffffffee8);
  if ((Response *)pcVar17 != pRVar3) {
    operator_delete(pcVar17,local_108._0_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
    pcVar17 = "Accept-Ranges";
    local_d0._M_dataplus._M_p = "bytes";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar1,(char **)&stack0xfffffffffffffee8,(char **)&local_d0);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  if (0x10 < (ulong)((long)(local_e8->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_e8->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)local_90,(string *)&stack0xfffffffffffffee8);
    pRVar3 = (Response *)(auStack_110 + 8);
    if ((Response *)pcVar17 != pRVar3) {
      operator_delete(pcVar17,local_108._0_8_ + 1);
    }
    pcVar17 = (char *)pRVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffee8,"Content-Type","");
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&pHVar1->_M_t,(key_type *)&stack0xfffffffffffffee8);
    if ((Response *)pcVar17 != pRVar3) {
      operator_delete(pcVar17,local_108._0_8_ + 1);
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var2) {
      std::__cxx11::string::_M_assign((string *)&local_d0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&pHVar1->_M_t,(const_iterator)__position._M_node);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffee8,"multipart/byteranges; boundary=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[13],std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar1,(char (*) [13])"Content-Type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffee8);
    if ((Response *)pcVar17 != pRVar3) {
      operator_delete(pcVar17,local_108._0_8_ + 1);
    }
  }
  uVar16 = auStack_110 + 8;
  this_00 = &res->body;
  length_00 = (res->body)._M_string_length;
  if (length_00 == 0) {
    length_01 = res->content_length;
    if ((char *)length_01 != (char *)0x0) {
      ppVar4 = (local_e8->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (local_e8->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar4 != ppVar5) {
        if ((long)ppVar5 - (long)ppVar4 == 0x10) {
          pdVar6 = (detail *)ppVar4->first;
          pcVar12 = (char *)ppVar4->second;
          if (((ulong)pdVar6 & (ulong)pcVar12) == 0xffffffffffffffff) {
            pdVar14 = (detail *)0x0;
            pcVar12 = (char *)length_01;
          }
          else {
            pdVar14 = (detail *)(length_01 + -(long)pcVar12);
            if (pdVar6 != (detail *)0xffffffffffffffff) {
              pdVar14 = pdVar6;
            }
            if (pdVar6 == (detail *)0xffffffffffffffff) {
              pcVar12 = (char *)(length_01 + -1);
            }
            if (pcVar12 == (char *)0xffffffffffffffff) {
              pcVar12 = (char *)(length_01 + -1);
            }
            pcVar12 = pcVar12 + (1 - (long)pdVar14);
          }
          detail::make_content_range_header_field_abi_cxx11_
                    ((string *)&stack0xfffffffffffffee8,pdVar14,(size_t)pcVar12,length_01,
                     (size_t)content_length);
          local_b0._M_p = "Content-Range";
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)pHVar1,&local_b0._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffee8);
          length_01 = pcVar12;
          if (pcVar17 != (char *)uVar16) {
            operator_delete(pcVar17,local_108._0_8_ + 1);
          }
        }
        else {
          length_01 = (char *)0x0;
          detail::
          process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                    (local_e8,res,(string *)local_90,&local_d0,
                     (anon_class_8_1_b58d1f7b)&stack0xfffffffffffffee8,
                     (anon_class_8_1_b58d1f7b)&stack0xfffffffffffffee8,
                     (anon_class_8_1_b58d1f7b)&stack0xfffffffffffffee8);
        }
      }
      cVar13 = '\x01';
      if ((char *)0x9 < (ulong)length_01) {
        pcVar17 = (char *)length_01;
        cVar7 = '\x04';
        do {
          cVar13 = cVar7;
          if (pcVar17 < (char *)0x64) {
            cVar13 = cVar13 + -2;
            goto LAB_0012238d;
          }
          if (pcVar17 < (char *)0x3e8) {
            cVar13 = cVar13 + -1;
            goto LAB_0012238d;
          }
          if (pcVar17 < (char *)0x2710) goto LAB_0012238d;
          bVar15 = (char *)0x1869f < pcVar17;
          pcVar17 = (char *)((ulong)pcVar17 / 10000);
          cVar7 = cVar13 + '\x04';
        } while (bVar15);
        cVar13 = cVar13 + '\x01';
      }
LAB_0012238d:
      std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffee8,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)uVar16,auStack_110._0_4_,length_01);
      local_b0._M_p = "Content-Length";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar1,&local_b0._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffee8);
      goto LAB_001223cc;
    }
    if ((res->content_provider).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_b0._M_p = "0";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar1,(char **)&stack0xfffffffffffffee8,&local_b0._M_p);
    }
    else {
      local_b0._M_p = "chunked";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar1,(char **)&stack0xfffffffffffffee8,&local_b0._M_p);
    }
  }
  else {
    ppVar4 = (local_e8->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (local_e8->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != ppVar5) {
      if ((long)ppVar5 - (long)ppVar4 == 0x10) {
        pdVar6 = (detail *)ppVar4->first;
        uVar11 = ppVar4->second;
        if (((ulong)pdVar6 & uVar11) == 0xffffffffffffffff) {
          pdVar14 = (detail *)0x0;
          offset = length_00;
        }
        else {
          pdVar14 = (detail *)(length_00 - uVar11);
          if (pdVar6 != (detail *)0xffffffffffffffff) {
            pdVar14 = pdVar6;
          }
          if (pdVar6 == (detail *)0xffffffffffffffff) {
            uVar11 = length_00 - 1;
          }
          if (uVar11 == 0xffffffffffffffff) {
            uVar11 = length_00 - 1;
          }
          offset = (uVar11 - (long)pdVar14) + 1;
        }
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)&stack0xfffffffffffffee8,pdVar14,offset,length_00,
                   (size_t)content_length);
        local_b0._M_p = "Content-Range";
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)pHVar1,&local_b0._M_p,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffee8);
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)this_00);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        }
        if ((Response *)pcVar17 != (Response *)(auStack_110 + 8)) {
LAB_001220ba:
          operator_delete(pcVar17,local_108._0_8_ + 1);
        }
      }
      else {
        auStack_110 = (undefined1  [8])0x0;
        local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
        local_b0._M_p = &stack0xfffffffffffffee8;
        content.res = (Response *)uVar16;
        content.data = &res->version;
        pcVar17 = (char *)uVar16;
        pRStack_a8 = res;
        detail::
        process_multipart_ranges_data<httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                  ((detail *)local_e8,(Request *)res,(Response *)local_90,&local_d0,
                   (string *)local_b0._M_p,(anon_class_8_1_898a9ca8)local_b0._M_p,
                   (anon_class_8_1_898a9ca8)local_b0._M_p,content);
        std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffee8);
        if (pcVar17 != (char *)uVar16) goto LAB_001220ba;
      }
    }
    uVar16 = auStack_110 + 8;
    uVar11 = (res->body)._M_string_length;
    cVar13 = '\x01';
    if (9 < uVar11) {
      uVar10 = uVar11;
      cVar7 = '\x04';
      do {
        cVar13 = cVar7;
        if (uVar10 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00122227;
        }
        if (uVar10 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00122227;
        }
        if (uVar10 < 10000) goto LAB_00122227;
        bVar15 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar7 = cVar13 + '\x04';
      } while (bVar15);
      cVar13 = cVar13 + '\x01';
    }
LAB_00122227:
    std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffee8,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)uVar16,auStack_110._0_4_,uVar11);
    local_b0._M_p = "Content-Length";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar1,&local_b0._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffee8);
LAB_001223cc:
    if ((Response *)uVar16 != (Response *)(auStack_110 + 8)) {
      operator_delete((void *)uVar16,local_108._0_8_ + 1);
    }
  }
  local_108._8_8_ = auStack_110;
  local_108._0_8_ = 0;
  auStack_110 = (undefined1  [8])0x0;
  sStack_f0 = 0;
  local_108._16_8_ = local_108._8_8_;
  iVar8 = detail::write_headers<httplib::Response>(local_d8,res,(Headers *)&stack0xfffffffffffffee8)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xfffffffffffffee8);
  if (iVar8 == 0) {
LAB_001224be:
    bVar15 = false;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar8 != 0) {
      if ((res->body)._M_string_length == 0) {
        if ((res->content_provider).super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_0012249a;
        bVar15 = write_content_with_provider
                           (local_e0,local_d8,local_e8,res,(string *)local_90,&local_d0);
        bVar15 = !bVar15;
      }
      else {
        iVar8 = (*local_d8->_vptr_Stream[5])(local_d8,this_00);
        bVar15 = iVar8 == 0;
      }
      if (bVar15) goto LAB_001224be;
    }
LAB_0012249a:
    bVar15 = true;
    if ((local_e0->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(local_e0->logger_)._M_invoker)((_Any_data *)&local_e0->logger_,local_e8,res);
    }
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar15;
}

Assistant:

inline bool Server::write_response(Stream &strm, bool last_connection,
                                   const Request &req, Response &res) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_) { error_handler_(req, res); }

  // Response line
  if (!strm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                         detail::status_message(res.status))) {
    return false;
  }

  // Headers
  if (last_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  }

  if (!last_connection && req.get_header_value("Connection") == "Keep-Alive") {
    res.set_header("Connection", "Keep-Alive");
  }

  if (!res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  std::string content_type;
  std::string boundary;

  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.headers.emplace("Content-Type",
                        "multipart/byteranges; boundary=" + boundary);
  }

  if (res.body.empty()) {
    if (res.content_length > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider) {
        res.set_header("Transfer-Encoding", "chunked");
      } else {
        res.set_header("Content-Length", "0");
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      res.body = res.body.substr(offset, length);
    } else {
      res.body =
          detail::make_multipart_ranges_data(req, res, boundary, content_type);
    }

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
    // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
    const auto &encodings = req.get_header_value("Accept-Encoding");
    if (encodings.find("gzip") != std::string::npos &&
        detail::can_compress(res.get_header_value("Content-Type"))) {
      if (detail::compress(res.body)) {
        res.set_header("Content-Encoding", "gzip");
      }
    }
#endif

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }

  if (!detail::write_headers(strm, res, Headers())) { return false; }

  // Body
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { return false; }
    } else if (res.content_provider) {
      if (!write_content_with_provider(strm, req, res, boundary,
                                       content_type)) {
        return false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}